

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

char wabt::anon_unknown_0::CWriter::MangleType(Type type)

{
  switch(type.enum_) {
  case ExternRef:
    return 'e';
  case FuncRef:
    return 'r';
  case 0xfffffff1:
  case 0xfffffff2:
  case 0xfffffff3:
  case FuncRef|I8U:
  case 0xfffffff5:
  case FuncRef|I16U:
  case FuncRef|I32U:
  case ~I32U:
  case I16:
  case I8:
    goto switchD_00141cc8_caseD_fffffff1;
  case V128:
    return 'o';
  case F64:
    return 'd';
  case F32:
    return 'f';
  case I64:
    return 'j';
  case I32:
    return 'i';
  default:
    if (type.enum_ == ExnRef) {
      return 'x';
    }
switchD_00141cc8_caseD_fffffff1:
    abort();
  }
}

Assistant:

constexpr char CWriter::MangleType(Type type) {
  // clang-format off
  switch (type) {
    case Type::I32: return 'i';
    case Type::I64: return 'j';
    case Type::F32: return 'f';
    case Type::F64: return 'd';
    case Type::V128: return 'o';
    case Type::FuncRef: return 'r';
    case Type::ExternRef: return 'e';
    case Type::ExnRef: return 'x';
    default:
      WABT_UNREACHABLE;
  }
  // clang-format on
}